

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void MergeRGBRow_C(uint8_t *src_r,uint8_t *src_g,uint8_t *src_b,uint8_t *dst_rgb,int width)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)width;
  if (width < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    *dst_rgb = src_r[uVar1];
    dst_rgb[1] = src_g[uVar1];
    dst_rgb[2] = src_b[uVar1];
    dst_rgb = dst_rgb + 3;
  }
  return;
}

Assistant:

void MergeRGBRow_C(const uint8_t* src_r,
                   const uint8_t* src_g,
                   const uint8_t* src_b,
                   uint8_t* dst_rgb,
                   int width) {
  int x;
  for (x = 0; x < width; ++x) {
    dst_rgb[0] = src_r[x];
    dst_rgb[1] = src_g[x];
    dst_rgb[2] = src_b[x];
    dst_rgb += 3;
  }
}